

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::String(String *this,uchar c)

{
  uchar *puVar1;
  
  puVar1 = (uchar *)malloc(2);
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = puVar1;
  if (puVar1 == (uchar *)0x0) {
    Bstrlib::String();
  }
  else {
    *puVar1 = c;
    puVar1[1] = '\0';
    (this->super_tagbstring).mlen = 2;
    (this->super_tagbstring).slen = 1;
  }
  return;
}

Assistant:

String::String(unsigned char c)
    {
        slen = mlen = 0; data = 0;
        data = (unsigned char*)malloc(2);
        if (data)
        {
            data[0] = c;
            data[1] = '\0';
            mlen = 2; slen = 1;
        } else
            bstringThrow("Failure in (char) constructor");
    }